

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.cpp
# Opt level: O1

void rw::AnimInterpolatorInfo::registerInterp(AnimInterpolatorInfo *interpInfo)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    if (*(long *)((long)&interpInfoList + lVar1) == 0) {
      *(AnimInterpolatorInfo **)((long)&interpInfoList + lVar1) = interpInfo;
      return;
    }
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x50);
  return;
}

Assistant:

void
AnimInterpolatorInfo::registerInterp(AnimInterpolatorInfo *interpInfo)
{
	for(int32 i = 0; i < MAXINTERPINFO; i++)
		if(interpInfoList[i] == nil){
			interpInfoList[i] = interpInfo;
			return;
		}
	assert(0 && "no room for interpolatorInfo");
}